

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserErrors xmlNewInputFromUrl(char *filename,xmlParserInputFlags flags,xmlParserInputPtr *out)

{
  xmlParserInputBufferCreateFilenameFunc *pp_Var1;
  xmlParserInputPtr pxVar2;
  xmlParserErrors local_3c;
  xmlParserErrors code;
  xmlParserInputPtr input;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr *out_local;
  char *pcStack_18;
  xmlParserInputFlags flags_local;
  char *filename_local;
  
  local_3c = XML_ERR_OK;
  if (out == (xmlParserInputPtr *)0x0) {
    filename_local._4_4_ = XML_ERR_ARGUMENT;
  }
  else {
    *out = (xmlParserInputPtr)0x0;
    if (filename == (char *)0x0) {
      filename_local._4_4_ = XML_ERR_ARGUMENT;
    }
    else {
      buf = (xmlParserInputBufferPtr)out;
      out_local._4_4_ = flags;
      pcStack_18 = filename;
      pp_Var1 = __xmlParserInputBufferCreateFilenameValue();
      if (*pp_Var1 == (xmlParserInputBufferCreateFilenameFunc)0x0) {
        local_3c = xmlParserInputBufferCreateUrl
                             (pcStack_18,XML_CHAR_ENCODING_NONE,out_local._4_4_,
                              (xmlParserInputBufferPtr *)&input);
      }
      else {
        pp_Var1 = __xmlParserInputBufferCreateFilenameValue();
        input = (xmlParserInputPtr)(**pp_Var1)(pcStack_18,XML_CHAR_ENCODING_NONE);
        if (input == (xmlParserInputPtr)0x0) {
          local_3c = XML_IO_ENOENT;
        }
      }
      if (local_3c == XML_ERR_OK) {
        pxVar2 = xmlNewInputInternal((xmlParserInputBufferPtr)input,pcStack_18);
        if (pxVar2 == (xmlParserInputPtr)0x0) {
          filename_local._4_4_ = XML_ERR_NO_MEMORY;
        }
        else {
          buf->context = pxVar2;
          filename_local._4_4_ = XML_ERR_OK;
        }
      }
      else {
        filename_local._4_4_ = local_3c;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

xmlParserErrors
xmlNewInputFromUrl(const char *filename, xmlParserInputFlags flags,
                   xmlParserInputPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;
    xmlParserErrors code = XML_ERR_OK;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;
    if (filename == NULL)
        return(XML_ERR_ARGUMENT);

    if (xmlParserInputBufferCreateFilenameValue != NULL) {
        buf = xmlParserInputBufferCreateFilenameValue(filename,
                XML_CHAR_ENCODING_NONE);
        if (buf == NULL)
            code = XML_IO_ENOENT;
    } else {
        code = xmlParserInputBufferCreateUrl(filename, XML_CHAR_ENCODING_NONE,
                                             flags, &buf);
    }
    if (code != XML_ERR_OK)
	return(code);

    input = xmlNewInputInternal(buf, filename);
    if (input == NULL)
	return(XML_ERR_NO_MEMORY);

    *out = input;
    return(XML_ERR_OK);
}